

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::Throw_IncorrectAttrValue(AMFImporter *this,string *pAttrName)

{
  int iVar1;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_a0,"Attribute \"",pAttrName);
  std::operator+(&local_80,&local_a0,"\" in node <");
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string((string *)&local_c0,(char *)CONCAT44(extraout_var,iVar1),&local_c1);
  std::operator+(&local_60,&local_80,&local_c0);
  std::operator+(&local_40,&local_60,"> has incorrect value.");
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::Throw_IncorrectAttrValue(const std::string& pAttrName)
{
	throw DeadlyImportError("Attribute \"" + pAttrName + "\" in node <" + std::string(mReader->getNodeName()) + "> has incorrect value.");
}